

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_tree.cpp
# Opt level: O0

string * __thiscall expr_tree::texify_abi_cxx11_(expr_tree *this,expr_node *node)

{
  char *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  int in_stack_0000006c;
  string *in_stack_00000098;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffd0;
  allocator<char> *in_stack_ffffffffffffffe0;
  
  switch((ulong)((int)*in_RDX - 1)) {
  case 0:
    std::__cxx11::to_string((long)in_RDI);
    break;
  case 1:
    std::__cxx11::to_string((double)in_RDI);
    break;
  case 2:
    ParToTex(in_stack_00000098);
    break;
  case 3:
    tld::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    at(in_stack_ffffffffffffffd0,(ulong)((int)*in_RDX - 1));
    ParToTex(in_stack_00000098);
    break;
  case 4:
    OpToTex_abi_cxx11_(in_stack_0000006c);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(in_RSI,in_RDX,in_stack_ffffffffffffffe0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe7);
  }
  return in_RDI;
}

Assistant:

std::string expr_tree::texify(const expr_node& node)
{
    switch (node.type) {
    case INT:
        return std::to_string(node.value.integer);
    case FRAC:
        return std::to_string(node.value.frac);
    case OP:
        return OpToTex(node.value.integer);
    case VAR:
        return ParToTex(this->variable_);
    case PAR:
        return ParToTex(this->parameters_.at(node.value.integer));
    default:
        return "nil";
    }
}